

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O0

int64_t spvtools::opt::anon_unknown_15::CalculateConstantTerm
                  (vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                   *recurrences,
                  vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                  *constants)

{
  bool bVar1;
  int iVar2;
  reference ppSVar3;
  SENode *pSVar4;
  undefined4 extraout_var;
  reference ppSVar5;
  int64_t iVar6;
  SEConstantNode *constant;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
  *__range2_1;
  SERecurrentNode *recurrence;
  const_iterator __end2;
  const_iterator __begin2;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  *__range2;
  int64_t constant_term;
  vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
  *constants_local;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  *recurrences_local;
  
  __range2 = (vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
              *)0x0;
  __end2 = std::
           vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
           ::begin(recurrences);
  recurrence = (SERecurrentNode *)
               std::
               vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
               ::end(recurrences);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<spvtools::opt::SERecurrentNode_*const_*,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
                                *)&recurrence);
    if (!bVar1) break;
    ppSVar3 = __gnu_cxx::
              __normal_iterator<spvtools::opt::SERecurrentNode_*const_*,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
              ::operator*(&__end2);
    pSVar4 = SERecurrentNode::GetOffset(*ppSVar3);
    iVar2 = (*pSVar4->_vptr_SENode[4])();
    iVar6 = SEConstantNode::FoldToSingleValue((SEConstantNode *)CONCAT44(extraout_var,iVar2));
    __range2 = (vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                *)((long)&(__range2->
                          super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                          )._M_impl.super__Vector_impl_data._M_start + iVar6);
    __gnu_cxx::
    __normal_iterator<spvtools::opt::SERecurrentNode_*const_*,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::
             vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
             ::begin(constants);
  constant = (SEConstantNode *)
             std::
             vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
             ::end(constants);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<spvtools::opt::SEConstantNode_*const_*,_std::vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>_>
                        *)&constant);
    if (!bVar1) break;
    ppSVar5 = __gnu_cxx::
              __normal_iterator<spvtools::opt::SEConstantNode_*const_*,_std::vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>_>
              ::operator*(&__end2_1);
    iVar6 = SEConstantNode::FoldToSingleValue(*ppSVar5);
    __range2 = (vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                *)((long)&(__range2->
                          super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                          )._M_impl.super__Vector_impl_data._M_start + iVar6);
    __gnu_cxx::
    __normal_iterator<spvtools::opt::SEConstantNode_*const_*,_std::vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>_>
    ::operator++(&__end2_1);
  }
  return (int64_t)__range2;
}

Assistant:

int64_t CalculateConstantTerm(const std::vector<SERecurrentNode*>& recurrences,
                              const std::vector<SEConstantNode*>& constants) {
  int64_t constant_term = 0;
  for (auto recurrence : recurrences) {
    constant_term +=
        recurrence->GetOffset()->AsSEConstantNode()->FoldToSingleValue();
  }

  for (auto constant : constants) {
    constant_term += constant->FoldToSingleValue();
  }

  return constant_term;
}